

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

string * __thiscall
trieste::utf8::escape_unicode_abi_cxx11_
          (string *__return_storage_ptr__,utf8 *this,string_view *input)

{
  ulong uVar1;
  undefined1 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ostringstream os;
  string_view local_1d0;
  pair<trieste::utf8::rune,_std::basic_string_view<char,_std::char_traits<char>_>_> local_1c0;
  undefined1 local_1a8 [24];
  undefined1 auStack_190 [88];
  undefined1 local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar1 = *(ulong *)this;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      local_1d0._M_len = uVar1 - uVar3;
      local_1d0._M_str = (char *)(*(long *)(this + 8) + uVar3);
      utf8_to_rune(&local_1c0,&local_1d0,false);
      if (local_1c0.first.value < 0x8000) {
        if (0x7f < local_1c0.first.value) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\u",2);
          *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
               *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) |
               0x4000;
          puVar2 = local_1a8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18);
          uVar4 = 4;
          if ((*(_func_int **)(local_1a8._0_8_ + -0x18))[(long)(local_138 + 0x71)] == (_func_int)0x0
             ) {
            std::ios::widen((char)puVar2);
            goto LAB_0018a1ec;
          }
          goto LAB_0018a1f8;
        }
        local_1d0._M_len = CONCAT71(local_1d0._M_len._1_7_,(char)local_1c0.first.value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1d0,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\U",2);
        *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
             *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 0x4000
        ;
        puVar2 = local_1a8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18);
        uVar4 = 8;
        if ((*(_func_int **)(local_1a8._0_8_ + -0x18))[(long)(local_138 + 0x71)] == (_func_int)0x0)
        {
          std::ios::widen((char)puVar2);
LAB_0018a1ec:
          puVar2[0xe1] = 1;
        }
LAB_0018a1f8:
        puVar2[0xe0] = 0x30;
        *(undefined8 *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = uVar4
        ;
        *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
             *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) &
             0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      uVar3 = uVar3 + local_1c0.second._M_len;
      uVar1 = *(ulong *)this;
    } while (uVar3 < uVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape_unicode(const std::string_view& input)
    {
      std::ostringstream os;
      std::size_t pos = 0;
      while (pos < input.size())
      {
        auto [r, s] = utf8_to_rune(input.substr(pos), false);
        if (r.value > 0x7FFF)
        {
          os << "\\U" << std::uppercase << std::setfill('0') << std::setw(8)
             << std::hex << r.value;
        }
        else if (r.value > 0x7F)
        {
          os << "\\u" << std::uppercase << std::setfill('0') << std::setw(4)
             << std::hex << r.value;
        }
        else
        {
          os << (char)r.value;
        }
        pos += s.size();
      }

      return os.str();
    }